

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsEval.c
# Opt level: O1

void SyncBlockcStatement_eval(JsAstNode *na,JsContext *context,JsValue *res)

{
  long lVar1;
  int iVar2;
  JsVm *pJVar3;
  __jmp_buf_tag *__env;
  JsValue *pJVar4;
  undefined4 *extraout_RDX;
  JsContext *val;
  JsEngine *val_00;
  double dVar5;
  JsValue JStack_c0;
  JsValue JStack_a8;
  JsContext *pJStack_90;
  undefined1 local_68 [8];
  JsValue v0;
  JsValue v1;
  
  context->pc = na->location;
  val = context;
  val_00 = (JsEngine *)na;
  v1.u.reference.name = (char *)res;
  pJVar3 = JsGetVm();
  if ((pJVar3->debug == 1) && (pJVar3 = JsGetVm(), pJVar3->trace != (JsVmTraceFn)0x0)) {
    pJVar3 = JsGetVm();
    val_00 = context->engine;
    val = (JsContext *)na->location;
    (*pJVar3->trace)(val_00,(JsLocation *)val,JS_TRACE_STATEMENT);
  }
  if (na[1].astClass == NODECLASS_Unary) {
    JsFindValueRef(context,(char *)na[1].location,(JsValue *)local_68);
    JsGetValue((JsValue *)local_68,(JsValue *)((long)&v0.u + 8));
    pJVar4 = &v1;
    if ((v0.u.completion.type != (JS_COMPLETION_THROW|JS_COMPLETION_BREAK)) || (v1._0_8_ == 0)) {
      JsThrowString("ident is\'t a object");
    }
  }
  else {
    if (na[1].astClass != NODECLASS_None) {
      SyncBlockcStatement_eval_cold_1();
      pJStack_90 = context;
      JsToNumber((JsValue *)val_00,&JStack_c0);
      JsToNumber((JsValue *)val,&JStack_a8);
      *extraout_RDX = 3;
      dVar5 = fmod(JStack_c0.u.number,JStack_a8.u.number);
      *(double *)(extraout_RDX + 2) = dVar5;
      return;
    }
    pJVar4 = (JsValue *)&context->thisObj;
  }
  lVar1 = *(long *)pJVar4;
  JsLockup(*(JsLock *)(lVar1 + 0x10));
  __env = (__jmp_buf_tag *)JsMalloc(200);
  iVar2 = _setjmp(__env);
  if (iVar2 == 0) {
    JsBuildDefender(__env);
    (*JsNodeClassEval[(*(JsAstNode **)(na + 2))->astClass])
              (*(JsAstNode **)(na + 2),context,(JsValue *)v1.u.reference.name);
    JsOmitDefender();
  }
  else {
    JsOmitDefender();
  }
  pJVar4 = JsCatchException();
  JsUnlock(*(JsLock *)(lVar1 + 0x10));
  if (pJVar4 != (JsValue *)0x0) {
    JsReThrowException(pJVar4);
  }
  return;
}

Assistant:

static void SyncBlockcStatement_eval(struct JsAstNode *na, 
        struct JsContext *context, struct JsValue *res){
		
	struct JsAstSyncBlockStatementNode *n = CAST_NODE(na, JsAstSyncBlockStatementNode);	
	TRACE(na->location, context, JS_TRACE_STATEMENT);
	
	struct JsObject* lockObj = NULL;
	struct JsValue* e = NULL;
	struct JsValue v0,v1;
	if(n->type == JS_SYNC_THIS_BLOCK_NODE){
		//this block
		lockObj = context->thisObj;
		
	}else if(n->type == JS_SYNC_IDENT_BLOCK_NODE){
		JsFindValueRef(context,n->ident,&v0);
		JsGetValue(&v0,&v1);
		if(v1.type != JS_OBJECT || v1.u.object == NULL){
			JsThrowString("ident is't a object");
		}
		lockObj = v1.u.object;
	}else{
		JsThrowString("synchronzied syntax error");
	}
	//对Block加锁
	JsLockup(lockObj->SyncLock);
	JS_TRY(0){
		EVAL(n->a,context,res);
	}
	JS_CATCH(e){
		//如果期间发现异常, 则先解锁, 在抛出
		JsUnlock(lockObj->SyncLock);
		JsReThrowException(e);
		return;
	}
	//对Block解锁
	JsUnlock(lockObj->SyncLock);
	return;
	
}